

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O2

void __thiscall
gog::anon_unknown_0::temporary_directory::~temporary_directory(temporary_directory *this)

{
  if ((this->path).m_pathname._M_string_length != 0) {
    boost::filesystem::remove_all(&this->path);
    if ((this->parent).m_pathname._M_string_length != 0) {
      boost::filesystem::remove((char *)this);
    }
  }
  std::__cxx11::string::~string((string *)&this->path);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~temporary_directory() {
		if(!path.empty()) {
			try {
				fs::remove_all(path);
				if(!parent.empty()) {
					fs::remove(parent);
				}
			} catch(...) {
				log_error << "Could not remove temporary directory " << path << '!';
			}
		}
	}